

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O1

SetRawReissueAssetResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::SetRawReissueAssetRequestStruct,cfd::js::api::SetRawReissueAssetResponseStruct>
          (SetRawReissueAssetResponseStruct *__return_storage_ptr__,api *this,
          SetRawReissueAssetRequestStruct *request,
          function<cfd::js::api::SetRawReissueAssetResponseStruct_(const_cfd::js::api::SetRawReissueAssetRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  long *plVar1;
  _Rb_tree_header *p_Var2;
  undefined1 auVar3 [12];
  anon_enum_32 local_13c;
  undefined1 local_138 [16];
  _Alloc_hider local_128;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  pointer local_d8;
  undefined1 local_d0 [24];
  undefined1 local_b8 [16];
  _Base_ptr local_a8 [2];
  undefined1 local_98 [24];
  _Rb_tree_node_base local_80;
  size_t local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_58;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->issuances).
           super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->issuances).
           super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var2 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cfd::Initialize();
  if ((request->tx).field_2._M_allocated_capacity == 0) {
    auVar3 = std::__throw_bad_function_call();
    if (auVar3._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar3._0_8_);
      local_108._0_8_ = "cfdjs_internal.h";
      local_108._8_4_ = 0x32;
      local_108._16_8_ = "ExecuteStructApi";
      local_13c = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_138._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_13c,(char **)local_138);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_108,cfde);
      InnerErrorResponseStruct::operator=
                (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_108);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_108);
      __cxa_end_catch();
    }
    else {
      plVar1 = (long *)__cxa_begin_catch(auVar3._0_8_);
      if (auVar3._8_4_ == 2) {
        local_108._0_8_ = "cfdjs_internal.h";
        local_108._8_4_ = 0x38;
        local_108._16_8_ = "ExecuteStructApi";
        local_138._0_8_ = (**(code **)(*plVar1 + 0x10))(plVar1);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)local_138);
        core::CfdException::CfdException((CfdException *)local_138);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_108,(CfdException *)local_138)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_108);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_108);
        core::CfdException::~CfdException((CfdException *)local_138);
        __cxa_end_catch();
      }
      else {
        local_108._0_8_ = "cfdjs_internal.h";
        local_108._8_4_ = 0x3d;
        local_108._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException((CfdException *)local_138);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_108,(CfdException *)local_138)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_108);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_108);
        core::CfdException::~CfdException((CfdException *)local_138);
        __cxa_end_catch();
      }
    }
  }
  else {
    (**(code **)((long)&(request->tx).field_2 + 8))((string *)local_108,request,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_108);
    local_138._0_8_ =
         (__return_storage_ptr__->issuances).
         super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_138._8_8_ =
         (__return_storage_ptr__->issuances).
         super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_128._M_p =
         (pointer)(__return_storage_ptr__->issuances).
                  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->issuances).
    super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108._32_8_;
    (__return_storage_ptr__->issuances).
    super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e0._M_p;
    (__return_storage_ptr__->issuances).
    super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
    local_108._32_8_ = 0;
    local_e0._M_p = (pointer)0x0;
    local_d8 = (pointer)0x0;
    std::
    vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ::~vector((vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
               *)local_138);
    (__return_storage_ptr__->error).code = local_d0._0_4_;
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->error).type,(string *)(local_d0 + 8));
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->error).message,(string *)local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
    if (local_80._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = local_80._M_color;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = local_80._M_parent;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = local_80._M_left;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = local_80._M_right;
      (local_80._M_parent)->_M_parent =
           &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
           = local_60;
      local_80._M_parent = (_Base_ptr)0x0;
      local_60 = 0;
      local_80._M_left = &local_80;
      local_80._M_right = &local_80;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
    if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var2 = &_Stack_58._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_58);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_98 + 0x10));
    if (local_a8[0] != (_Base_ptr)local_98) {
      operator_delete(local_a8[0]);
    }
    if ((undefined1 *)local_d0._8_8_ != local_b8) {
      operator_delete((void *)local_d0._8_8_);
    }
    std::
    vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ::~vector((vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
               *)(local_108 + 0x20));
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}